

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void __thiscall helics::MessageFederate::~MessageFederate(MessageFederate *this)

{
  ~MessageFederate((MessageFederate *)
                   ((long)&this->_vptr_MessageFederate + (long)this->_vptr_MessageFederate[-3]));
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}